

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O1

void calc_grid(void)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  dVar10 = dt;
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar5 = uVar5 + 1;
    uVar6 = uVar5 & 0xffffffff;
    if (uVar5 == 0x32) {
      uVar6 = 0;
    }
    lVar8 = 0;
    do {
      *(double *)((long)ax[0] + lVar3 + lVar8) =
           *(double *)((long)p[0] + lVar3 + lVar8) - *(double *)((long)p[uVar6] + lVar8);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 400);
    lVar3 = lVar3 + 400;
  } while (uVar5 != 0x32);
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar5 = uVar5 + 1;
    uVar6 = uVar5 & 0xffffffff;
    if (uVar5 == 0x32) {
      uVar6 = 0;
    }
    lVar8 = 0;
    do {
      *(double *)((long)ay[0] + lVar3 + lVar8) =
           *(double *)((long)p[0] + lVar3 + lVar8) - *(double *)((long)p[0] + uVar6 * 8 + lVar8);
      lVar8 = lVar8 + 400;
    } while (lVar8 != 20000);
    lVar3 = lVar3 + 8;
  } while (uVar5 != 0x32);
  dVar10 = dVar10 * 10.0;
  lVar3 = 0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      lVar4 = lVar3 + lVar9;
      dVar1 = *(double *)((long)ay[0] + lVar4);
      dVar2 = *(double *)((long)vy[0] + lVar4);
      *(double *)((long)vx[0] + lVar4) =
           *(double *)((long)ax[0] + lVar4) * dVar10 + *(double *)((long)vx[0] + lVar4);
      *(double *)((long)vy[0] + lVar4) = dVar1 * dVar10 + dVar2;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 400);
    lVar8 = lVar8 + 1;
    lVar3 = lVar3 + 400;
  } while (lVar8 != 0x32);
  lVar4 = 0x1764f8;
  lVar3 = 0x16c8b8;
  lVar9 = 0x1716d8;
  lVar8 = 1;
  do {
    lVar7 = 0;
    do {
      *(double *)(lVar3 + lVar7 * 8) =
           (((*(double *)(lVar9 + -400 + lVar7 * 8) - *(double *)(lVar9 + lVar7 * 8)) +
            *(double *)(lVar4 + -8 + lVar7 * 8)) - *(double *)(lVar4 + lVar7 * 8)) * dVar10 +
           *(double *)(lVar3 + lVar7 * 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x31);
    lVar8 = lVar8 + 1;
    lVar4 = lVar4 + 400;
    lVar3 = lVar3 + 400;
    lVar9 = lVar9 + 400;
  } while (lVar8 != 0x32);
  return;
}

Assistant:

void calc_grid(void)
{
    int x, y, x2, y2;
    double time_step = dt * ANIMATION_SPEED;

    // Compute accelerations
    for (x = 0;  x < GRIDW;  x++)
    {
        x2 = (x + 1) % GRIDW;
        for(y = 0; y < GRIDH; y++)
            ax[x][y] = p[x][y] - p[x2][y];
    }

    for (y = 0;  y < GRIDH;  y++)
    {
        y2 = (y + 1) % GRIDH;
        for(x = 0; x < GRIDW; x++)
            ay[x][y] = p[x][y] - p[x][y2];
    }

    // Compute speeds
    for (x = 0;  x < GRIDW;  x++)
    {
        for (y = 0;  y < GRIDH;  y++)
        {
            vx[x][y] = vx[x][y] + ax[x][y] * time_step;
            vy[x][y] = vy[x][y] + ay[x][y] * time_step;
        }
    }

    // Compute pressure
    for (x = 1;  x < GRIDW;  x++)
    {
        x2 = x - 1;
        for (y = 1;  y < GRIDH;  y++)
        {
            y2 = y - 1;
            p[x][y] = p[x][y] + (vx[x2][y] - vx[x][y] + vy[x][y2] - vy[x][y]) * time_step;
        }
    }
}